

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Destroy<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
          (RepeatedPtrFieldBase *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *failure_msg;
  LogMessage *pLVar4;
  void **ppvVar5;
  Rep *p;
  int local_64;
  int i;
  void **elems;
  Voidify local_41;
  Nullable<const_char_*> local_40;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  int n;
  Voidify local_19;
  RepeatedPtrFieldBase *local_18;
  RepeatedPtrFieldBase *this_local;
  
  local_18 = this;
  bVar1 = NeedsDestroy(this);
  absl_log_internal_check_op_result._7_1_ = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&n,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0xee,"NeedsDestroy()");
    absl_log_internal_check_op_result._7_1_ = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&n);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar4);
  }
  if ((absl_log_internal_check_op_result._7_1_ & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&n);
  }
  if (this->arena_ == (Arena *)0x0) {
    absl_log_internal_check_op_result._0_4_ = allocated_size(this);
    iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue
                      ((int)absl_log_internal_check_op_result);
    iVar3 = Capacity(this);
    iVar3 = absl::lts_20250127::log_internal::GetReferenceableValue(iVar3);
    local_40 = absl::lts_20250127::log_internal::Check_LEImpl(iVar2,iVar3,"n <= Capacity()");
    if (local_40 != (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_40);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&elems,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0xf6,failure_msg);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&elems);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&elems)
      ;
    }
    ppvVar5 = elements(this);
    for (local_64 = 0; local_64 < (int)absl_log_internal_check_op_result; local_64 = local_64 + 1) {
      if (local_64 + 5 < (int)absl_log_internal_check_op_result) {
        this_local = (RepeatedPtrFieldBase *)ppvVar5[local_64 + 5];
      }
      Delete<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                (ppvVar5[local_64],(Arena *)0x0);
    }
    bVar1 = using_sso(this);
    if (!bVar1) {
      p = rep(this);
      iVar2 = Capacity(this);
      SizedDelete(p,(long)iVar2 * 8 + 8);
    }
  }
  return;
}

Assistant:

void Destroy() {
    ABSL_DCHECK(NeedsDestroy());

    // TODO: arena check is redundant once all `RepeatedPtrField`s
    // with non-null arena are owned by the arena.
    if (ABSL_PREDICT_FALSE(arena_ != nullptr)) return;

    using H = CommonHandler<TypeHandler>;
    int n = allocated_size();
    ABSL_DCHECK_LE(n, Capacity());
    void** elems = elements();
    for (int i = 0; i < n; i++) {
      if (i + 5 < n) {
        absl::PrefetchToLocalCacheNta(elems[i + 5]);
      }
      Delete<H>(elems[i], nullptr);
    }
    if (!using_sso()) {
      internal::SizedDelete(rep(),
                            Capacity() * sizeof(elems[0]) + kRepHeaderSize);
    }
  }